

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

Token * __thiscall EOPlus::Lexer::ReadSymbol(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  string *this_00;
  char c;
  string local_d8;
  code *local_b8 [2];
  code *local_a8;
  code *local_a0;
  undefined1 local_98 [64];
  variant local_58;
  
  local_b8[1] = (code *)0x0;
  c = '\0';
  local_b8[0] = ctype_symbol;
  local_a0 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
  local_a8 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
  bVar1 = GetCharIf(this,&c,(function<bool_(char)> *)local_b8);
  std::_Function_base::~_Function_base((_Function_base *)local_b8);
  if (bVar1) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,'\x01');
    util::variant::variant((variant *)local_98,&local_d8);
    Token::Token(__return_storage_ptr__,Symbol,(variant *)local_98);
    std::__cxx11::string::~string((string *)(local_98 + 0x10));
    this_00 = &local_d8;
  }
  else {
    util::variant::variant(&local_58);
    Token::Token(__return_storage_ptr__,Invalid,&local_58);
    this_00 = &local_58.val_string;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadSymbol()
	{
		char c = '\0';

		if (!this->GetCharIf(c, ctype_symbol))
			return Token();

		return Token(Token::Symbol, std::string(1, c));
	}